

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezeReliablePdu.cpp
# Opt level: O1

bool __thiscall
DIS::StopFreezeReliablePdu::operator==(StopFreezeReliablePdu *this,StopFreezeReliablePdu *rhs)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = SimulationManagementWithReliabilityFamilyPdu::operator==
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                     &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  bVar2 = ClockTime::operator==(&this->_realWorldTime,&rhs->_realWorldTime);
  return ((bVar2 && bVar1) && this->_reason == rhs->_reason) &&
         ((this->_requiredReliablityService == rhs->_requiredReliablityService &&
          this->_frozenBehavior == rhs->_frozenBehavior) &&
         (this->_requestID == rhs->_requestID && this->_pad1 == rhs->_pad1));
}

Assistant:

bool StopFreezeReliablePdu::operator ==(const StopFreezeReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_realWorldTime == rhs._realWorldTime) ) ivarsEqual = false;
     if( ! (_reason == rhs._reason) ) ivarsEqual = false;
     if( ! (_frozenBehavior == rhs._frozenBehavior) ) ivarsEqual = false;
     if( ! (_requiredReliablityService == rhs._requiredReliablityService) ) ivarsEqual = false;
     if( ! (_pad1 == rhs._pad1) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }